

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O0

bool __thiscall
ODDLParser::OpenDDLExport::writeNodeHeader(OpenDDLExport *this,DDLNode *node,string *statement)

{
  string *psVar1;
  ulong uVar2;
  string *name;
  string *statement_local;
  DDLNode *node_local;
  OpenDDLExport *this_local;
  
  if (node == (DDLNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    psVar1 = DDLNode::getType_abi_cxx11_(node);
    std::__cxx11::string::operator+=((string *)statement,(string *)psVar1);
    psVar1 = DDLNode::getName_abi_cxx11_(node);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)statement," ");
      std::__cxx11::string::operator+=((string *)statement,"$");
      std::__cxx11::string::operator+=((string *)statement,(string *)psVar1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool OpenDDLExport::writeNodeHeader( DDLNode *node, std::string &statement ) {
    if (ddl_nullptr == node) {
        return false;
    }

    statement += node->getType();
    const std::string &name( node->getName() );
    if ( !name.empty() ) {
        statement += " ";
        statement += "$";
        statement += name;
    }

    return true;
}